

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.c
# Opt level: O0

void * cloneOption(char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  void *result;
  void *value_local;
  char *name_local;
  
  if ((name == (char *)0x0) || (value == (void *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                ,"cloneOption",0x128,1,"invalid argument (name=%p, value=%p)",name,value);
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    iVar1 = strcmp(SAVED_OPTION_MAX_ENQUEUE_TIME_SECS,name);
    if (((iVar1 == 0) || (iVar1 = strcmp(SAVED_OPTION_MAX_PROCESSING_TIME_SECS,name), iVar1 == 0))
       || (iVar1 = strcmp(SAVED_OPTION_MAX_RETRY_COUNT,name), iVar1 == 0)) {
      l = (LOGGER_LOG)malloc(8);
      if (l == (LOGGER_LOG)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                    ,"cloneOption",0x131,1,"failed cloning option %s (malloc failed)",name);
        }
      }
      else {
        *(undefined8 *)l = *value;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                  ,"cloneOption",0x13a,1,"option %s is invalid",name);
      }
      l = (LOGGER_LOG)0x0;
    }
  }
  return l;
}

Assistant:

static void* cloneOption(const char* name, const void* value)
{
    void* result;

    if (name == NULL || value == NULL)
    {
        LogError("invalid argument (name=%p, value=%p)", name, value);
        result = NULL;
    }
    else if (strcmp(SAVED_OPTION_MAX_ENQUEUE_TIME_SECS, name) == 0 ||
        strcmp(SAVED_OPTION_MAX_PROCESSING_TIME_SECS, name) == 0 ||
        strcmp(SAVED_OPTION_MAX_RETRY_COUNT, name) == 0)
    {
        if ((result = malloc(sizeof(size_t))) == NULL)
        {
            LogError("failed cloning option %s (malloc failed)", name);
        }
        else
        {
            memcpy(result, value, sizeof(size_t));
        }
    }
    else
    {
        LogError("option %s is invalid", name);
        result = NULL;
    }

    return result;
}